

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O0

void __thiscall dg::debug::LLVMDGDumpBlocks::dumpBlock(LLVMDGDumpBlocks *this,LLVMBBlock *blk)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 *puVar4;
  uint64_t uVar5;
  BBlock<dg::LLVMNode> *in_RSI;
  ostream *in_RDI;
  uint slice_id;
  uint len;
  uint i;
  string str;
  raw_os_ostream ro;
  ostringstream ostr;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint local_1f8;
  string local_1f0 [32];
  raw_os_ostream local_1d0 [72];
  ostringstream local_188 [376];
  BBlock<dg::LLVMNode> *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RDI + 0xd0,"NODE");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  std::operator<<(poVar2," [label=\"");
  std::__cxx11::ostringstream::ostringstream(local_188);
  llvm::raw_os_ostream::raw_os_ostream
            ((raw_os_ostream *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_RDI)
  ;
  BBlock<dg::LLVMNode>::getKey(local_10);
  llvm::operator<<((raw_ostream *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (Value *)in_RDI);
  llvm::raw_ostream::flush
            ((raw_ostream *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::__cxx11::ostringstream::str();
  local_1f8 = 0;
  while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0), *pcVar3 != '\0') {
    if (local_1f8 < 0x28) {
      local_1f8 = local_1f8 + 1;
    }
    else {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_1f0);
      *puVar4 = 10;
      local_1f8 = 0;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
    if (*pcVar3 == '\n') {
      local_1f8 = 0;
    }
  }
  uVar5 = BBlock<dg::LLVMNode>::getSlice(local_10);
  uVar1 = (uint)uVar5;
  if (uVar1 != 0) {
    poVar2 = std::operator<<((ostream *)((Value *)in_RDI + 0xd0),"\\nslice: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::operator<<(poVar2,"\\n");
  }
  poVar2 = std::operator<<((ostream *)((Value *)in_RDI + 0xd0),local_1f0);
  std::operator<<(poVar2,"\"");
  if (uVar1 != 0) {
    std::operator<<((ostream *)((Value *)in_RDI + 0xd0),"style=filled fillcolor=greenyellow");
  }
  std::operator<<((ostream *)((Value *)in_RDI + 0xd0),"]\n");
  std::__cxx11::string::~string(local_1f0);
  llvm::raw_os_ostream::~raw_os_ostream(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void dumpBlock(LLVMBBlock *blk) {
        out << "NODE" << blk << " [label=\"";

        std::ostringstream ostr;
        llvm::raw_os_ostream ro(ostr);

        ro << *blk->getKey();
        ro.flush();
        std::string str = ostr.str();

        unsigned int i = 0;
        unsigned int len = 0;
        while (str[i] != 0) {
            if (len >= 40) {
                str[i] = '\n';
                len = 0;
            } else
                ++len;

            if (str[i] == '\n')
                len = 0;

            ++i;
        }

        unsigned int slice_id = blk->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id << "\\n";
        out << str << "\"";

        if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";

        out << "]\n";
    }